

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O0

void calc<float>(options *opt)

{
  fvar<float,_2UL> fVar1;
  fvar<float,_2UL> beta_00;
  fvar<float,_2UL> beta_01;
  fvar<float,_2UL> f_00;
  fvar<float,_2UL> f_01;
  _Setprecision _Var2;
  invalid_argument *piVar3;
  ostream *poVar4;
  ostream *poVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  root_type rVar12;
  autodiff_fvar<float,_2UL> f_02;
  fvar<float,_2UL> f;
  float in_stack_00000140;
  float in_stack_00000144;
  float in_stack_00000148;
  autodiff_fvar<float,_2UL> beta;
  real_t t;
  real_t dT;
  real_t Tmax;
  real_t Tmin;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  ostream *in_stack_fffffffffffffe70;
  undefined4 local_188;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  char cVar13;
  float fVar14;
  undefined4 local_178;
  undefined8 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  undefined4 uVar15;
  float local_34;
  
  fVar7 = convert<float>((string *)0x1127a0);
  fVar8 = convert<float>((string *)0x1127ba);
  fVar9 = convert<float>((string *)0x1127d4);
  local_34 = convert<float>((string *)0x1127ee);
  fVar10 = convert<float>((string *)0x11280b);
  fVar11 = convert<float>((string *)0x112828);
  if (fVar10 < local_34) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    uVar15 = SUB84(piVar3,0);
    std::invalid_argument::invalid_argument(piVar3,"Tmax should be larger than Tmin");
    __cxa_throw(uVar15,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (fVar11 <= 0.0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"dT should be positive");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var2 = std::setprecision(6);
  poVar5 = std::operator<<(poVar4,_Var2);
  poVar5 = std::operator<<(poVar5,"# lattice: triangular\n");
  poVar5 = std::operator<<(poVar5,"# precision: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,6);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar5,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n");
  for (; local_34 < fVar11 * 0.0001 + fVar10; local_34 = fVar11 + local_34) {
    f_02 = boost::math::differentiation::autodiff_v1::make_fvar<float,_2UL>
                     ((float *)in_stack_fffffffffffffe70);
    ising::free_energy::triangular::
    infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
              (in_stack_00000148,in_stack_00000144,in_stack_00000140,stack0x0000015c);
    poVar5 = std::operator<<((ostream *)&std::cout,"inf inf ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar7);
    fVar14 = 4.48416e-44;
    poVar5 = std::operator<<(poVar5,' ');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar8);
    poVar5 = std::operator<<(poVar5,SUB41(fVar14,0));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar9);
    poVar5 = std::operator<<(poVar5,SUB41(fVar14,0));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_34);
    poVar5 = std::operator<<(poVar5,SUB41(fVar14,0));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1.0 / local_34);
    in_stack_fffffffffffffe70 = std::operator<<(poVar5,SUB41(fVar14,0));
    f_00.v._M_elems[2] = in_stack_fffffffffffffea0;
    f_00.v._M_elems[0] = (float)(int)in_stack_fffffffffffffe98;
    f_00.v._M_elems[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    fVar1.v._M_elems[1] = (float)in_stack_fffffffffffffe80;
    fVar1.v._M_elems[0] = (float)in_stack_fffffffffffffe7c;
    fVar1.v._M_elems[2] = fVar14;
    rVar12 = ising::free_energy::
             free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       (f_00,fVar1);
    poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe70,rVar12);
    poVar5 = std::operator<<(poVar5,SUB41(fVar14,0));
    local_188 = SUB84(poVar5,0);
    in_stack_fffffffffffffe7c = (undefined4)((ulong)poVar5 >> 0x20);
    f_01.v._M_elems[2] = in_stack_fffffffffffffea0;
    f_01.v._M_elems[0] = (float)(int)in_stack_fffffffffffffe98;
    f_01.v._M_elems[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    beta_00.v._M_elems[1] = (float)in_stack_fffffffffffffe80;
    beta_00.v._M_elems[0] = (float)in_stack_fffffffffffffe7c;
    beta_00.v._M_elems[2] = fVar14;
    rVar12 = ising::free_energy::
             energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       (f_01,beta_00);
    cVar13 = SUB41(fVar14,0);
    poVar5 = (ostream *)
             std::ostream::operator<<((void *)CONCAT44(in_stack_fffffffffffffe7c,local_188),rVar12);
    poVar5 = std::operator<<(poVar5,cVar13);
    local_178 = SUB84(poVar5,0);
    fVar14 = (float)((ulong)poVar5 >> 0x20);
    beta_01.v._M_elems._4_8_ = poVar4;
    beta_01.v._M_elems[0] = fVar14;
    rVar12 = ising::free_energy::
             specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       ((fvar<float,_2UL>)f_02.v._M_elems,beta_01);
    pvVar6 = (void *)std::ostream::operator<<((void *)CONCAT44(fVar14,local_178),rVar12);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}